

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testwinprops.cpp
# Opt level: O2

void testwin7(wins *wins_ar,int ar_len)

{
  long *plVar1;
  ulong uVar2;
  ulong uVar3;
  Am_Style aAStack_48 [8];
  Am_Style local_40 [8];
  Am_Style local_38 [8];
  
  puts("Entering testwin7:");
  uVar3 = 0;
  printf("  Hit RETURN to change background color of D2:");
  getchar();
  uVar2 = (ulong)(uint)ar_len;
  if (ar_len < 1) {
    uVar2 = uVar3;
  }
  uVar2 = uVar2 * 0x40;
  for (; uVar2 != uVar3; uVar3 = uVar3 + 0x40) {
    plVar1 = *(long **)((long)&wins_ar->d2 + uVar3);
    Am_Style::Am_Style(local_38,(Am_Style *)&yellow);
    (**(code **)(*plVar1 + 0x80))(plVar1,local_38);
    Am_Style::~Am_Style(local_38);
  }
  printf("  Hit RETURN to revert background color of D2:");
  getchar();
  for (uVar3 = 0; uVar2 != uVar3; uVar3 = uVar3 + 0x40) {
    plVar1 = *(long **)((long)&wins_ar->d2 + uVar3);
    Am_Style::Am_Style(local_40,(Am_Style *)&green);
    (**(code **)(*plVar1 + 0x80))(plVar1,local_40);
    Am_Style::~Am_Style(local_40);
  }
  printf("  Hit RETURN to change background color of D1:");
  getchar();
  for (uVar3 = 0; uVar2 != uVar3; uVar3 = uVar3 + 0x40) {
    plVar1 = *(long **)((long)&wins_ar->d1 + uVar3);
    Am_Style::Am_Style(aAStack_48,(Am_Style *)&purple);
    (**(code **)(*plVar1 + 0x80))(plVar1,aAStack_48);
    Am_Style::~Am_Style(aAStack_48);
  }
  return;
}

Assistant:

void
testwin7(wins *wins_ar, int ar_len)
{

  printf("Entering testwin7:\n");
  printf("  Hit RETURN to change background color of D2:");
  getchar();
  int i;
  for (i = 0; i < ar_len; i++) {
    (wins_ar[i].d2)->Set_Background_Color(yellow);
  }

  printf("  Hit RETURN to revert background color of D2:");
  getchar();
  for (i = 0; i < ar_len; i++) {
    (wins_ar[i].d2)->Set_Background_Color(green);
  }

  printf("  Hit RETURN to change background color of D1:");
  getchar();
  for (i = 0; i < ar_len; i++) {
    (wins_ar[i].d1)->Set_Background_Color(purple);
  }
}